

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

void rtmidi_open_port(RtMidiPtr device,uint portNumber,char *portName)

{
  RtMidiError *err;
  allocator<char> local_41;
  string local_40 [8];
  string name;
  char *portName_local;
  uint portNumber_local;
  RtMidiPtr device_local;
  
  name.field_2._8_8_ = portName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,portName,&local_41);
  std::allocator<char>::~allocator(&local_41);
  (*(code *)**device->ptr)(device->ptr,portNumber,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void rtmidi_open_port (RtMidiPtr device, unsigned int portNumber, const char *portName)
{
    std::string name = portName;
    try {
        ((RtMidi*) device->ptr)->openPort (portNumber, name);

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
    }
}